

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateMembers
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  JavaType JVar1;
  FieldDescriptor *field;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  
  vars = &this->variables_;
  text._M_str = 
  "private static final class $capitalized_name$DefaultEntryHolder {\n  static final com.google.protobuf.MapEntry<\n      $type_parameters$> defaultEntry =\n          com.google.protobuf.MapEntry\n          .<$type_parameters$>newDefaultInstance(\n              $descriptor$\n              $key_wire_type$,\n              $key_default_value$,\n              $value_wire_type$,\n              $value_default_value$);\n}\n"
  ;
  text._M_len = 0x196;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text);
  text_00._M_str =
       "@SuppressWarnings(\"serial\")\nprivate com.google.protobuf.MapField<\n    $type_parameters$> $name$_;\nprivate com.google.protobuf.MapField<$type_parameters$>\ninternalGet$capitalized_name$() {\n  if ($name$_ == null) {\n    return com.google.protobuf.MapField.emptyMapField(\n        $map_field_parameter$);\n  }\n  return $name$_;\n}\n"
  ;
  text_00._M_len = 0x144;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_00);
  field = MapValueField(this->descriptor_);
  JVar1 = GetJavaType(field);
  if (JVar1 == JAVATYPE_ENUM) {
    text_01._M_str =
         "private static final\ncom.google.protobuf.Internal.MapAdapter.Converter<\n    java.lang.Integer, $value_enum_type$> $name$ValueConverter =\n        com.google.protobuf.Internal.MapAdapter.newEnumConverter(\n            $value_enum_type$.internalGetValueMap(),\n            $unrecognized_value$);\n"
    ;
    text_01._M_len = 0x123;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_01);
    text_02._M_str =
         "private static final java.util.Map<$boxed_key_type$, $value_enum_type$>\ninternalGetAdapted$capitalized_name$Map(\n    java.util.Map<$boxed_key_type$, $boxed_value_type$> map) {\n  return new com.google.protobuf.Internal.MapAdapter<\n      $boxed_key_type$, $value_enum_type$, java.lang.Integer>(\n          map, $name$ValueConverter);\n}\n"
    ;
    text_02._M_len = 0x14d;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_02);
  }
  GenerateMapGetters(this,printer);
  return;
}

Assistant:

void ImmutableMapFieldGenerator::GenerateMembers(io::Printer* printer) const {
  printer->Print(
      variables_,
      "private static final class $capitalized_name$DefaultEntryHolder {\n"
      "  static final com.google.protobuf.MapEntry<\n"
      "      $type_parameters$> defaultEntry =\n"
      "          com.google.protobuf.MapEntry\n"
      "          .<$type_parameters$>newDefaultInstance(\n"
      "              $descriptor$\n"
      "              $key_wire_type$,\n"
      "              $key_default_value$,\n"
      "              $value_wire_type$,\n"
      "              $value_default_value$);\n"
      "}\n");
  printer->Print(variables_,
                 "@SuppressWarnings(\"serial\")\n"
                 "private com.google.protobuf.MapField<\n"
                 "    $type_parameters$> $name$_;\n"
                 "private com.google.protobuf.MapField<$type_parameters$>\n"
                 "internalGet$capitalized_name$() {\n"
                 "  if ($name$_ == null) {\n"
                 "    return com.google.protobuf.MapField.emptyMapField(\n"
                 "        $map_field_parameter$);\n"
                 "  }\n"
                 "  return $name$_;\n"
                 "}\n");
  if (GetJavaType(MapValueField(descriptor_)) == JAVATYPE_ENUM) {
    printer->Print(
        variables_,
        "private static final\n"
        "com.google.protobuf.Internal.MapAdapter.Converter<\n"
        "    java.lang.Integer, $value_enum_type$> $name$ValueConverter =\n"
        "        com.google.protobuf.Internal.MapAdapter.newEnumConverter(\n"
        "            $value_enum_type$.internalGetValueMap(),\n"
        "            $unrecognized_value$);\n");
    printer->Print(
        variables_,
        "private static final java.util.Map<$boxed_key_type$, "
        "$value_enum_type$>\n"
        "internalGetAdapted$capitalized_name$Map(\n"
        "    java.util.Map<$boxed_key_type$, $boxed_value_type$> map) {\n"
        "  return new com.google.protobuf.Internal.MapAdapter<\n"
        "      $boxed_key_type$, $value_enum_type$, java.lang.Integer>(\n"
        "          map, $name$ValueConverter);\n"
        "}\n");
  }
  GenerateMapGetters(printer);
}